

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,long64 topY)

{
  HorzJoinRec *pHVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  IntPoint pt1b;
  IntPoint pt1a;
  IntPoint pt2a;
  IntPoint pt2;
  IntPoint pt2_00;
  IntPoint pt4;
  IntPoint pt2b;
  IntPoint pt4_00;
  bool bVar6;
  pointer ppHVar7;
  long lVar8;
  TEdge **ppTVar9;
  TEdge *pTVar10;
  TEdge *pTVar11;
  TEdge **ppTVar12;
  TEdge *pTVar13;
  ulong uVar14;
  IntPoint pt1;
  IntPoint pt1_00;
  IntPoint pt3;
  IntPoint pt3_00;
  TEdge *local_a0;
  IntPoint local_98;
  TEdge **local_88;
  long local_80;
  long64 local_78;
  long lStack_70;
  IntPoint local_68;
  long64 local_50;
  long64 lStack_48;
  long64 local_40;
  long64 lStack_38;
  
  pTVar13 = this->m_ActiveEdges;
  local_a0 = pTVar13;
  if (pTVar13 != (TEdge *)0x0) {
    ppTVar12 = &this->m_ActiveEdges;
    local_88 = ppTVar12;
    local_80 = topY;
    do {
      local_a0 = pTVar13;
      if ((pTVar13->ytop == topY) && (pTVar13->nextInLML == (TEdge *)0x0)) {
        pTVar10 = pTVar13->next;
        if ((pTVar10 == (TEdge *)0x0) ||
           (((pTVar10->ytop != pTVar13->ytop || (pTVar10->nextInLML != (TEdge *)0x0)) ||
            (pTVar11 = pTVar10, pTVar10->xtop != pTVar13->xtop)))) {
          pTVar11 = pTVar13->prev;
        }
        if (-1e-20 < pTVar11->dx + 1e+40) {
          if (((pTVar10 == (TEdge *)0x0) || (pTVar10->ytop != pTVar13->ytop)) ||
             ((pTVar10->nextInLML != (TEdge *)0x0 || (pTVar10->xtop != pTVar13->xtop)))) {
            pTVar10 = pTVar13->prev;
          }
          if (pTVar10->dx + 1e+40 < 1e-20) goto LAB_006846a7;
        }
        pTVar10 = pTVar13->prevInAEL;
        DoMaxima(this,pTVar13,topY);
        ppTVar9 = &pTVar10->nextInAEL;
        if (pTVar10 == (TEdge *)0x0) {
          ppTVar9 = ppTVar12;
        }
      }
      else {
LAB_006846a7:
        lVar8 = pTVar13->ytop;
        if (lVar8 == topY) {
          if ((pTVar13->nextInLML == (TEdge *)0x0) || (1e-20 <= ABS(pTVar13->nextInLML->dx + 1e+40))
             ) {
            if (lVar8 != topY) goto LAB_0068482e;
            lVar8 = pTVar13->xtop;
            goto LAB_0068485b;
          }
          if (-1 < pTVar13->outIdx) {
            local_98.X = pTVar13->xtop;
            local_98.Y = lVar8;
            AddOutPt(this,pTVar13,&local_98);
            ppHVar7 = (this->m_HorizJoins).
                      super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((this->m_HorizJoins).
                super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                ._M_impl.super__Vector_impl_data._M_finish != ppHVar7) {
              uVar14 = 0;
              do {
                local_98.X = 0;
                local_98.Y = 0;
                local_68.X = 0;
                local_68.Y = 0;
                pHVar1 = ppHVar7[uVar14];
                pTVar10 = pHVar1->edge;
                pt1a.X = pTVar10->xbot;
                pt1a.Y = pTVar10->ybot;
                pt1b.X = pTVar10->xtop;
                pt1b.Y = pTVar10->ytop;
                pTVar11 = pTVar13->nextInLML;
                pt2a.X = pTVar11->xbot;
                pt2a.Y = pTVar11->ybot;
                local_40 = pTVar11->xtop;
                lStack_38 = pTVar11->ytop;
                pt2b.X = pTVar11->xtop;
                pt2b.Y = pTVar11->ytop;
                bVar6 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_98,&local_68);
                if (bVar6) {
                  AddJoin(this,pTVar10,pTVar11,pHVar1->savedIdx,pTVar13->outIdx);
                }
                uVar14 = uVar14 + 1;
                ppHVar7 = (this->m_HorizJoins).
                          super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              } while (uVar14 < (ulong)((long)(this->m_HorizJoins).
                                              super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppHVar7 >> 3));
            }
            AddHorzJoin(this,pTVar13->nextInLML,pTVar13->outIdx);
            topY = local_80;
            ppTVar12 = local_88;
          }
          UpdateEdgeIntoAEL(this,&local_a0);
          if (this->m_SortedEdges == (TEdge *)0x0) {
            this->m_SortedEdges = local_a0;
            local_a0->nextInSEL = (TEdge *)0x0;
            local_a0->prevInSEL = (TEdge *)0x0;
          }
          else {
            local_a0->nextInSEL = this->m_SortedEdges;
            local_a0->prevInSEL = (TEdge *)0x0;
            this->m_SortedEdges->prevInSEL = local_a0;
            this->m_SortedEdges = local_a0;
          }
        }
        else {
LAB_0068482e:
          dVar5 = (double)(topY - pTVar13->ybot) * pTVar13->dx;
          lVar8 = (long)(dVar5 + *(double *)(&DAT_0071ab00 + (ulong)(dVar5 < 0.0) * 8)) +
                  pTVar13->xbot;
LAB_0068485b:
          pTVar13->xcurr = lVar8;
          pTVar13->ycurr = topY;
        }
        ppTVar9 = &local_a0->nextInAEL;
      }
      pTVar13 = *ppTVar9;
    } while (pTVar13 != (TEdge *)0x0);
    local_a0 = (TEdge *)0x0;
  }
  ProcessHorizontals(this);
  local_a0 = this->m_ActiveEdges;
  if (local_a0 != (TEdge *)0x0) {
    do {
      if ((local_a0->ytop == topY) && (local_a0->nextInLML != (TEdge *)0x0)) {
        if (-1 < local_a0->outIdx) {
          local_98.X = local_a0->xtop;
          local_98.Y = local_a0->ytop;
          AddOutPt(this,local_a0,&local_98);
        }
        UpdateEdgeIntoAEL(this,&local_a0);
        pTVar13 = local_a0;
        if ((((local_a0->outIdx < 0) || (pTVar10 = local_a0->prevInAEL, pTVar10 == (TEdge *)0x0)) ||
            (pTVar10->outIdx < 0)) ||
           ((lVar8 = local_a0->xbot, pTVar10->xcurr != lVar8 ||
            (lVar2 = local_a0->ybot, pTVar10->ycurr != lVar2)))) {
LAB_00684a6c:
          if (((-1 < pTVar13->outIdx) && (pTVar10 = pTVar13->nextInAEL, pTVar10 != (TEdge *)0x0)) &&
             (-1 < pTVar10->outIdx)) {
            lVar8 = pTVar10->ycurr;
            lVar2 = pTVar10->ytop;
            if ((((lVar2 < lVar8) && (lVar8 <= pTVar10->ybot)) &&
                (lVar3 = pTVar13->xbot, pTVar10->xcurr == lVar3)) &&
               (lVar4 = pTVar13->ybot, lVar8 == lVar4)) {
              pt2_00.X = pTVar13->xtop;
              pt2_00.Y = pTVar13->ytop;
              local_78 = pTVar10->xtop;
              pt4.Y = lVar2;
              pt4.X = local_78;
              pt1_00.Y = lVar4;
              pt1_00.X = lVar3;
              pt3_00.Y = lVar4;
              pt3_00.X = lVar3;
              lStack_70 = lVar2;
              bVar6 = SlopesEqual(pt1_00,pt2_00,pt3_00,pt4,
                                  (bool)(this->_vptr_Clipper[-3] + 0x10)
                                        [(long)&(this->m_PolyOuts).
                                                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                        ]);
              if (bVar6) {
                ppTVar12 = &pTVar13->nextInAEL;
                pTVar10 = pTVar13->nextInAEL;
                goto LAB_00684a37;
              }
            }
          }
        }
        else {
          pt2.X = local_a0->xtop;
          pt2.Y = local_a0->ytop;
          local_50 = pTVar10->xtop;
          lStack_48 = pTVar10->ytop;
          pt4_00.X = pTVar10->xtop;
          pt4_00.Y = pTVar10->ytop;
          pt1.Y = lVar2;
          pt1.X = lVar8;
          pt3.Y = lVar2;
          pt3.X = lVar8;
          bVar6 = SlopesEqual(pt1,pt2,pt3,pt4_00,
                              (bool)(this->_vptr_Clipper[-3] + 0x10)
                                    [(long)&(this->m_PolyOuts).
                                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                    ]);
          if (!bVar6) goto LAB_00684a6c;
          ppTVar12 = &pTVar13->prevInAEL;
          pTVar10 = pTVar13->prevInAEL;
LAB_00684a37:
          local_98.X = pTVar13->xbot;
          local_98.Y = pTVar13->ybot;
          AddOutPt(this,pTVar10,&local_98);
          AddJoin(this,pTVar13,*ppTVar12,-1,-1);
        }
      }
      local_a0 = local_a0->nextInAEL;
    } while (local_a0 != (TEdge *)0x0);
  }
  return;
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const long64 topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    if( IsMaxima(e, topY) && !NEAR_EQUAL(GetMaximaPair(e)->dx, HORIZONTAL) )
    {
      //'e' might be removed from AEL, as may any following edges so ...
      TEdge* ePrior = e->prevInAEL;
      DoMaxima(e, topY);
      if( !ePrior ) e = m_ActiveEdges;
      else e = ePrior->nextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update xcurr and ycurr ...
      if(  IsIntermediate(e, topY) && NEAR_EQUAL(e->nextInLML->dx, HORIZONTAL) )
      {
        if (e->outIdx >= 0)
        {
          AddOutPt(e, IntPoint(e->xtop, e->ytop));

          for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
          {
            IntPoint pt, pt2;
            HorzJoinRec* hj = m_HorizJoins[i];
            if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
              IntPoint(hj->edge->xtop, hj->edge->ytop),
              IntPoint(e->nextInLML->xbot, e->nextInLML->ybot),
              IntPoint(e->nextInLML->xtop, e->nextInLML->ytop), pt, pt2))
                AddJoin(hj->edge, e->nextInLML, hj->savedIdx, e->outIdx);
          }

          AddHorzJoin(e->nextInLML, e->outIdx);
        }
        UpdateEdgeIntoAEL(e);
        AddEdgeToSEL(e);
      } else
      {
        //this just simplifies horizontal processing ...
        e->xcurr = TopX( *e, topY );
        e->ycurr = topY;
      }
      e = e->nextInAEL;
    }
  }

  //3. Process horizontals at the top of the scanbeam ...
  ProcessHorizontals();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while( e )
  {
    if( IsIntermediate( e, topY ) )
    {
      if( e->outIdx >= 0 ) AddOutPt(e, IntPoint(e->xtop,e->ytop));
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      if (e->outIdx >= 0 && e->prevInAEL && e->prevInAEL->outIdx >= 0 &&
        e->prevInAEL->xcurr == e->xbot && e->prevInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->prevInAEL->xtop, e->prevInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->prevInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->prevInAEL);
      }
      else if (e->outIdx >= 0 && e->nextInAEL && e->nextInAEL->outIdx >= 0 &&
        e->nextInAEL->ycurr > e->nextInAEL->ytop &&
        e->nextInAEL->ycurr <= e->nextInAEL->ybot &&
        e->nextInAEL->xcurr == e->xbot && e->nextInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->nextInAEL->xtop, e->nextInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->nextInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->nextInAEL);
      }
    }
    e = e->nextInAEL;
  }
}